

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  lVar12 = (long)bit * 0x100;
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x170);
  iVar14 = -iVar11;
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1f0);
  iVar9 = -iVar10;
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1b0);
  iVar6 = -iVar13;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x230);
  iVar7 = -iVar2;
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x250);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1d0);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  auVar17._4_4_ = iVar14;
  auVar17._0_4_ = iVar14;
  auVar17._8_4_ = iVar14;
  auVar17._12_4_ = iVar14;
  auVar17._16_4_ = iVar14;
  auVar17._20_4_ = iVar14;
  auVar17._24_4_ = iVar14;
  auVar17._28_4_ = iVar14;
  auVar21._4_4_ = iVar9;
  auVar21._0_4_ = iVar9;
  auVar21._8_4_ = iVar9;
  auVar21._12_4_ = iVar9;
  auVar21._16_4_ = iVar9;
  auVar21._20_4_ = iVar9;
  auVar21._24_4_ = iVar9;
  auVar21._28_4_ = iVar9;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x210);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  auVar42._4_4_ = iVar6;
  auVar42._0_4_ = iVar6;
  auVar42._8_4_ = iVar6;
  auVar42._12_4_ = iVar6;
  auVar42._16_4_ = iVar6;
  auVar42._20_4_ = iVar6;
  auVar42._24_4_ = iVar6;
  auVar42._28_4_ = iVar6;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 400);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar36._4_4_ = iVar7;
  auVar36._0_4_ = iVar7;
  auVar36._8_4_ = iVar7;
  auVar36._12_4_ = iVar7;
  auVar36._16_4_ = iVar7;
  auVar36._20_4_ = iVar7;
  auVar36._24_4_ = iVar7;
  auVar36._28_4_ = iVar7;
  auVar41._4_4_ = iVar15;
  auVar41._0_4_ = iVar15;
  auVar41._8_4_ = iVar15;
  auVar41._12_4_ = iVar15;
  auVar41._16_4_ = iVar15;
  auVar41._20_4_ = iVar15;
  auVar41._24_4_ = iVar15;
  auVar41._28_4_ = iVar15;
  auVar5 = vpmulld_avx2((undefined1  [32])in[1],auVar32);
  auVar17 = vpmulld_avx2((undefined1  [32])in[0xf],auVar17);
  auVar5 = vpaddd_avx2(auVar41,auVar5);
  auVar5 = vpaddd_avx2(auVar5,auVar17);
  auVar17 = vpmulld_avx2((undefined1  [32])in[9],auVar26);
  auVar21 = vpmulld_avx2((undefined1  [32])in[7],auVar21);
  auVar17 = vpaddd_avx2(auVar41,auVar17);
  auVar17 = vpaddd_avx2(auVar17,auVar21);
  auVar21 = vpmulld_avx2((undefined1  [32])in[5],auVar39);
  auVar42 = vpmulld_avx2((undefined1  [32])in[0xb],auVar42);
  auVar21 = vpaddd_avx2(auVar41,auVar21);
  auVar21 = vpaddd_avx2(auVar21,auVar42);
  auVar18 = vpmulld_avx2((undefined1  [32])in[3],auVar36);
  auVar42 = vpmulld_avx2((undefined1  [32])in[0xd],auVar38);
  auVar42 = vpaddd_avx2(auVar41,auVar42);
  auVar42 = vpaddd_avx2(auVar18,auVar42);
  auVar18._4_4_ = iVar2;
  auVar18._0_4_ = iVar2;
  auVar18._8_4_ = iVar2;
  auVar18._12_4_ = iVar2;
  auVar18._16_4_ = iVar2;
  auVar18._20_4_ = iVar2;
  auVar18._24_4_ = iVar2;
  auVar18._28_4_ = iVar2;
  auVar18 = vpmulld_avx2((undefined1  [32])in[0xd],auVar18);
  auVar19 = vpmulld_avx2((undefined1  [32])in[3],auVar38);
  auVar18 = vpaddd_avx2(auVar41,auVar18);
  auVar18 = vpaddd_avx2(auVar18,auVar19);
  auVar19._4_4_ = iVar13;
  auVar19._0_4_ = iVar13;
  auVar19._8_4_ = iVar13;
  auVar19._12_4_ = iVar13;
  auVar19._16_4_ = iVar13;
  auVar19._20_4_ = iVar13;
  auVar19._24_4_ = iVar13;
  auVar19._28_4_ = iVar13;
  auVar19 = vpmulld_avx2((undefined1  [32])in[5],auVar19);
  auVar22 = vpmulld_avx2((undefined1  [32])in[0xb],auVar39);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x180);
  iVar6 = -iVar13;
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x200);
  auVar19 = vpaddd_avx2(auVar41,auVar19);
  auVar19 = vpaddd_avx2(auVar22,auVar19);
  iVar7 = -iVar2;
  auVar22._4_4_ = iVar10;
  auVar22._0_4_ = iVar10;
  auVar22._8_4_ = iVar10;
  auVar22._12_4_ = iVar10;
  auVar22._16_4_ = iVar10;
  auVar22._20_4_ = iVar10;
  auVar22._24_4_ = iVar10;
  auVar22._28_4_ = iVar10;
  auVar22 = vpmulld_avx2((undefined1  [32])in[9],auVar22);
  auVar26 = vpmulld_avx2((undefined1  [32])in[7],auVar26);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x240);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar16._4_4_ = iVar11;
  auVar16._0_4_ = iVar11;
  auVar16._8_4_ = iVar11;
  auVar16._12_4_ = iVar11;
  auVar16._16_4_ = iVar11;
  auVar16._20_4_ = iVar11;
  auVar16._24_4_ = iVar11;
  auVar16._28_4_ = iVar11;
  auVar30._4_4_ = iVar6;
  auVar30._0_4_ = iVar6;
  auVar30._8_4_ = iVar6;
  auVar30._12_4_ = iVar6;
  auVar30._16_4_ = iVar6;
  auVar30._20_4_ = iVar6;
  auVar30._24_4_ = iVar6;
  auVar30._28_4_ = iVar6;
  auVar22 = vpaddd_avx2(auVar41,auVar22);
  auVar22 = vpaddd_avx2(auVar22,auVar26);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1c0);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  auVar27._4_4_ = iVar7;
  auVar27._0_4_ = iVar7;
  auVar27._8_4_ = iVar7;
  auVar27._12_4_ = iVar7;
  auVar27._16_4_ = iVar7;
  auVar27._20_4_ = iVar7;
  auVar27._24_4_ = iVar7;
  auVar27._28_4_ = iVar7;
  auVar26 = vpmulld_avx2((undefined1  [32])in[1],auVar16);
  auVar16 = vpmulld_avx2((undefined1  [32])in[0xf],auVar32);
  auVar26 = vpaddd_avx2(auVar41,auVar26);
  auVar26 = vpaddd_avx2(auVar26,auVar16);
  auVar16 = vpmulld_avx2((undefined1  [32])in[2],auVar40);
  auVar30 = vpmulld_avx2((undefined1  [32])in[0xe],auVar30);
  auVar16 = vpaddd_avx2(auVar41,auVar16);
  auVar16 = vpaddd_avx2(auVar16,auVar30);
  auVar27 = vpmulld_avx2((undefined1  [32])in[6],auVar27);
  auVar30 = vpmulld_avx2((undefined1  [32])in[10],auVar23);
  auVar30 = vpaddd_avx2(auVar41,auVar30);
  auVar30 = vpaddd_avx2(auVar30,auVar27);
  auVar28._4_4_ = iVar2;
  auVar28._0_4_ = iVar2;
  auVar28._8_4_ = iVar2;
  auVar28._12_4_ = iVar2;
  auVar28._16_4_ = iVar2;
  auVar28._20_4_ = iVar2;
  auVar28._24_4_ = iVar2;
  auVar28._28_4_ = iVar2;
  auVar27 = vpmulld_avx2((undefined1  [32])in[10],auVar28);
  auVar23 = vpmulld_avx2((undefined1  [32])in[6],auVar23);
  auVar27 = vpaddd_avx2(auVar41,auVar27);
  auVar27 = vpaddd_avx2(auVar27,auVar23);
  auVar29._4_4_ = iVar13;
  auVar29._0_4_ = iVar13;
  auVar29._8_4_ = iVar13;
  auVar29._12_4_ = iVar13;
  auVar29._16_4_ = iVar13;
  auVar29._20_4_ = iVar13;
  auVar29._24_4_ = iVar13;
  auVar29._28_4_ = iVar13;
  auVar23 = vpmulld_avx2((undefined1  [32])in[2],auVar29);
  auVar28 = vpmulld_avx2((undefined1  [32])in[0xe],auVar40);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1e0);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  auVar29 = vpsrad_avx2(auVar5,ZEXT416((uint)bit));
  auVar32 = vpsrad_avx2(auVar17,ZEXT416((uint)bit));
  auVar25 = ZEXT416((uint)bit);
  auVar36 = vpsrad_avx2(auVar21,auVar25);
  auVar42 = vpsrad_avx2(auVar42,auVar25);
  auVar18 = vpsrad_avx2(auVar18,auVar25);
  auVar19 = vpsrad_avx2(auVar19,auVar25);
  auVar25 = ZEXT416((uint)bit);
  auVar22 = vpsrad_avx2(auVar22,auVar25);
  auVar26 = vpsrad_avx2(auVar26,auVar25);
  auVar5 = vpaddd_avx2(auVar41,auVar23);
  auVar5 = vpaddd_avx2(auVar5,auVar28);
  auVar17 = vpaddd_avx2(auVar32,auVar29);
  auVar28 = vpsubd_avx2(auVar29,auVar32);
  auVar21 = vpaddd_avx2(auVar42,auVar36);
  auVar29 = vpsubd_avx2(auVar42,auVar36);
  auVar42 = vpaddd_avx2(auVar19,auVar18);
  auVar32 = vpsubd_avx2(auVar18,auVar19);
  auVar18 = vpaddd_avx2(auVar22,auVar26);
  auVar36 = vpsubd_avx2(auVar26,auVar22);
  auVar19 = vpmulld_avx2(auVar34,(undefined1  [32])*in);
  auVar19 = vpaddd_avx2(auVar41,auVar19);
  auVar26 = vpmulld_avx2(auVar34,(undefined1  [32])in[8]);
  auVar22 = vpaddd_avx2(auVar19,auVar26);
  auVar38 = vpsubd_avx2(auVar19,auVar26);
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x220);
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1a0);
  iVar13 = -iVar10;
  auVar31._4_4_ = iVar11;
  auVar31._0_4_ = iVar11;
  auVar31._8_4_ = iVar11;
  auVar31._12_4_ = iVar11;
  auVar31._16_4_ = iVar11;
  auVar31._20_4_ = iVar11;
  auVar31._24_4_ = iVar11;
  auVar31._28_4_ = iVar11;
  auVar33._4_4_ = iVar13;
  auVar33._0_4_ = iVar13;
  auVar33._8_4_ = iVar13;
  auVar33._12_4_ = iVar13;
  auVar33._16_4_ = iVar13;
  auVar33._20_4_ = iVar13;
  auVar33._24_4_ = iVar13;
  auVar33._28_4_ = iVar13;
  auVar23 = vpsrad_avx2(auVar16,auVar25);
  auVar19 = vpmulld_avx2((undefined1  [32])in[4],auVar31);
  auVar19 = vpaddd_avx2(auVar19,auVar41);
  auVar26 = vpmulld_avx2((undefined1  [32])in[0xc],auVar33);
  auVar19 = vpaddd_avx2(auVar19,auVar26);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar35._4_4_ = iVar10;
  auVar35._0_4_ = iVar10;
  auVar35._8_4_ = iVar10;
  auVar35._12_4_ = iVar10;
  auVar35._16_4_ = iVar10;
  auVar35._20_4_ = iVar10;
  auVar35._24_4_ = iVar10;
  auVar35._28_4_ = iVar10;
  auVar26 = vpmulld_avx2((undefined1  [32])in[4],auVar35);
  auVar16 = vpmulld_avx2((undefined1  [32])in[0xc],auVar31);
  auVar26 = vpaddd_avx2(auVar26,auVar41);
  auVar26 = vpaddd_avx2(auVar26,auVar16);
  auVar27 = vpsrad_avx2(auVar27,auVar25);
  auVar16 = vpaddd_avx2(auVar23,auVar30);
  auVar23 = vpsubd_avx2(auVar23,auVar30);
  auVar30 = vpsrad_avx2(auVar5,auVar25);
  auVar5 = vpaddd_avx2(auVar30,auVar27);
  auVar30 = vpsubd_avx2(auVar30,auVar27);
  iVar11 = -iVar11;
  iVar13 = bd + (uint)(do_cols == 0) * 2;
  iVar10 = 0x8000;
  if (0xf < iVar13 + 6) {
    iVar10 = 1 << ((char)iVar13 + 5U & 0x1f);
  }
  iVar13 = -iVar10;
  iVar10 = iVar10 + -1;
  auVar20._4_4_ = iVar13;
  auVar20._0_4_ = iVar13;
  auVar20._8_4_ = iVar13;
  auVar20._12_4_ = iVar13;
  auVar20._16_4_ = iVar13;
  auVar20._20_4_ = iVar13;
  auVar20._24_4_ = iVar13;
  auVar20._28_4_ = iVar13;
  auVar24._4_4_ = iVar10;
  auVar24._0_4_ = iVar10;
  auVar24._8_4_ = iVar10;
  auVar24._12_4_ = iVar10;
  auVar24._16_4_ = iVar10;
  auVar24._20_4_ = iVar10;
  auVar24._24_4_ = iVar10;
  auVar24._28_4_ = iVar10;
  auVar27 = vpmaxsd_avx2(auVar28,auVar20);
  auVar39 = vpminsd_avx2(auVar27,auVar24);
  auVar27 = vpmaxsd_avx2(auVar36,auVar20);
  auVar36 = vpminsd_avx2(auVar27,auVar24);
  auVar27 = vpmulld_avx2(auVar39,auVar33);
  auVar27 = vpaddd_avx2(auVar27,auVar41);
  auVar28 = vpmulld_avx2(auVar36,auVar31);
  auVar27 = vpaddd_avx2(auVar27,auVar28);
  auVar37._4_4_ = iVar11;
  auVar37._0_4_ = iVar11;
  auVar37._8_4_ = iVar11;
  auVar37._12_4_ = iVar11;
  auVar37._16_4_ = iVar11;
  auVar37._20_4_ = iVar11;
  auVar37._24_4_ = iVar11;
  auVar37._28_4_ = iVar11;
  auVar28 = vpmaxsd_avx2(auVar20,auVar29);
  auVar29 = vpminsd_avx2(auVar28,auVar24);
  auVar28 = vpmaxsd_avx2(auVar20,auVar32);
  auVar32 = vpminsd_avx2(auVar28,auVar24);
  auVar28 = vpmulld_avx2(auVar29,auVar37);
  auVar28 = vpaddd_avx2(auVar28,auVar41);
  auVar40 = vpmulld_avx2(auVar32,auVar33);
  auVar28 = vpaddd_avx2(auVar28,auVar40);
  auVar29 = vpmulld_avx2(auVar29,auVar33);
  auVar32 = vpmulld_avx2(auVar32,auVar31);
  auVar29 = vpaddd_avx2(auVar41,auVar29);
  auVar29 = vpaddd_avx2(auVar32,auVar29);
  auVar32 = vpmulld_avx2(auVar39,auVar31);
  auVar31 = vpsrad_avx2(auVar22,auVar25);
  auVar36 = vpmulld_avx2(auVar36,auVar35);
  auVar38 = vpsrad_avx2(auVar38,auVar25);
  auVar22 = vpaddd_avx2(auVar41,auVar32);
  auVar22 = vpaddd_avx2(auVar22,auVar36);
  auVar25 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar26,auVar25);
  auVar26 = vpaddd_avx2(auVar32,auVar31);
  auVar36 = vpsubd_avx2(auVar31,auVar32);
  auVar32 = vpsrad_avx2(auVar19,auVar25);
  auVar19 = vpaddd_avx2(auVar32,auVar38);
  auVar38 = vpsubd_avx2(auVar38,auVar32);
  auVar23 = vpmaxsd_avx2(auVar20,auVar23);
  auVar23 = vpminsd_avx2(auVar23,auVar24);
  auVar30 = vpmaxsd_avx2(auVar20,auVar30);
  auVar30 = vpminsd_avx2(auVar30,auVar24);
  auVar23 = vpmulld_avx2(auVar23,auVar34);
  auVar32 = vpmulld_avx2(auVar30,auVar34);
  auVar30 = vpsubd_avx2(auVar41,auVar23);
  auVar30 = vpaddd_avx2(auVar30,auVar32);
  auVar23 = vpaddd_avx2(auVar41,auVar23);
  auVar23 = vpaddd_avx2(auVar23,auVar32);
  auVar17 = vpmaxsd_avx2(auVar20,auVar17);
  auVar32 = vpminsd_avx2(auVar17,auVar24);
  auVar17 = vpmaxsd_avx2(auVar20,auVar21);
  auVar27 = vpsrad_avx2(auVar27,auVar25);
  auVar21 = vpminsd_avx2(auVar17,auVar24);
  auVar28 = vpsrad_avx2(auVar28,auVar25);
  auVar17 = vpaddd_avx2(auVar21,auVar32);
  auVar32 = vpsubd_avx2(auVar32,auVar21);
  auVar21 = vpaddd_avx2(auVar28,auVar27);
  auVar31 = vpsubd_avx2(auVar27,auVar28);
  auVar42 = vpmaxsd_avx2(auVar20,auVar42);
  auVar27 = vpminsd_avx2(auVar42,auVar24);
  auVar42 = vpmaxsd_avx2(auVar20,auVar18);
  auVar28 = vpsrad_avx2(auVar29,auVar25);
  auVar18 = vpminsd_avx2(auVar42,auVar24);
  auVar22 = vpsrad_avx2(auVar22,auVar25);
  auVar42 = vpaddd_avx2(auVar18,auVar27);
  auVar29 = vpsubd_avx2(auVar18,auVar27);
  auVar18 = vpaddd_avx2(auVar28,auVar22);
  auVar27 = vpsubd_avx2(auVar22,auVar28);
  auVar5 = vpmaxsd_avx2(auVar20,auVar5);
  auVar22 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar26,auVar20);
  auVar26 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpaddd_avx2(auVar26,auVar22);
  auVar33 = vpsubd_avx2(auVar26,auVar22);
  auVar19 = vpmaxsd_avx2(auVar19,auVar20);
  auVar26 = vpsrad_avx2(auVar23,auVar25);
  auVar22 = vpminsd_avx2(auVar19,auVar24);
  auVar19 = vpaddd_avx2(auVar26,auVar22);
  auVar35 = vpsubd_avx2(auVar22,auVar26);
  auVar22 = vpmaxsd_avx2(auVar20,auVar38);
  auVar26 = vpminsd_avx2(auVar22,auVar24);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar22 = vpaddd_avx2(auVar30,auVar26);
  auVar38 = vpsubd_avx2(auVar26,auVar30);
  auVar26 = vpmaxsd_avx2(auVar20,auVar16);
  auVar16 = vpminsd_avx2(auVar26,auVar24);
  auVar26 = vpmaxsd_avx2(auVar20,auVar36);
  auVar30 = vpminsd_avx2(auVar26,auVar24);
  auVar26 = vpaddd_avx2(auVar30,auVar16);
  auVar36 = vpsubd_avx2(auVar30,auVar16);
  auVar16 = vpmaxsd_avx2(auVar31,auVar20);
  auVar30 = vpminsd_avx2(auVar16,auVar24);
  auVar16 = vpmaxsd_avx2(auVar27,auVar20);
  auVar16 = vpminsd_avx2(auVar16,auVar24);
  auVar30 = vpmulld_avx2(auVar30,auVar34);
  auVar27 = vpmulld_avx2(auVar16,auVar34);
  auVar16 = vpsubd_avx2(auVar41,auVar30);
  auVar16 = vpaddd_avx2(auVar16,auVar27);
  auVar30 = vpaddd_avx2(auVar41,auVar30);
  auVar30 = vpaddd_avx2(auVar30,auVar27);
  auVar27 = vpmaxsd_avx2(auVar20,auVar32);
  auVar23 = vpminsd_avx2(auVar27,auVar24);
  auVar27 = vpmaxsd_avx2(auVar29,auVar20);
  auVar27 = vpminsd_avx2(auVar27,auVar24);
  auVar28 = vpsrad_avx2(auVar16,auVar25);
  auVar16 = vpmulld_avx2(auVar23,auVar34);
  auVar27 = vpmulld_avx2(auVar27,auVar34);
  auVar23 = vpsrad_avx2(auVar30,auVar25);
  auVar30 = vpsubd_avx2(auVar41,auVar16);
  auVar16 = vpaddd_avx2(auVar16,auVar41);
  auVar30 = vpaddd_avx2(auVar30,auVar27);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar16 = vpaddd_avx2(auVar16,auVar27);
  auVar27 = vpsrad_avx2(auVar16,auVar25);
  auVar42 = vpmaxsd_avx2(auVar20,auVar42);
  auVar42 = vpminsd_avx2(auVar42,auVar24);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  auVar16 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpaddd_avx2(auVar16,auVar42);
  auVar42 = vpsubd_avx2(auVar16,auVar42);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  *out = alVar3;
  auVar5 = vpmaxsd_avx2(auVar42,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[0xf] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar20,auVar18);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar19,auVar20);
  auVar18 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpaddd_avx2(auVar18,auVar42);
  auVar18 = vpsubd_avx2(auVar18,auVar42);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[1] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar22,auVar20);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar18,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[0xe] = alVar3;
  auVar5 = vpaddd_avx2(auVar42,auVar23);
  auVar18 = vpsubd_avx2(auVar42,auVar23);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[2] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar26,auVar20);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar18,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[0xd] = alVar3;
  auVar5 = vpaddd_avx2(auVar27,auVar42);
  auVar18 = vpsubd_avx2(auVar42,auVar27);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[3] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar36,auVar20);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar18,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[0xc] = alVar3;
  auVar5 = vpaddd_avx2(auVar30,auVar42);
  auVar18 = vpsubd_avx2(auVar42,auVar30);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[4] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar38,auVar20);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar18,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[0xb] = alVar3;
  auVar5 = vpaddd_avx2(auVar28,auVar42);
  auVar18 = vpsubd_avx2(auVar42,auVar28);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[5] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar20,auVar21);
  auVar21 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar20,auVar35);
  auVar42 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar18,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[10] = alVar3;
  auVar5 = vpaddd_avx2(auVar42,auVar21);
  auVar42 = vpsubd_avx2(auVar42,auVar21);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[6] = alVar3;
  auVar5 = vpmaxsd_avx2(auVar20,auVar17);
  auVar17 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar20,auVar33);
  auVar21 = vpminsd_avx2(auVar5,auVar24);
  auVar5 = vpmaxsd_avx2(auVar42,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  out[9] = alVar3;
  auVar5 = vpaddd_avx2(auVar21,auVar17);
  auVar17 = vpsubd_avx2(auVar21,auVar17);
  auVar5 = vpmaxsd_avx2(auVar5,auVar20);
  auVar17 = vpmaxsd_avx2(auVar17,auVar20);
  alVar3 = (__m256i)vpminsd_avx2(auVar5,auVar24);
  alVar4 = (__m256i)vpminsd_avx2(auVar17,auVar24);
  out[7] = alVar3;
  out[8] = alVar4;
  if (do_cols == 0) {
    bVar8 = 10;
    if (10 < bd) {
      bVar8 = (byte)bd;
    }
    local_a0 = 0x20 << (bVar8 & 0x1f);
    local_80 = -local_a0;
    local_a0 = local_a0 + -1;
    iStack_9c = local_a0;
    iStack_98 = local_a0;
    iStack_94 = local_a0;
    iStack_90 = local_a0;
    iStack_8c = local_a0;
    iStack_88 = local_a0;
    iStack_84 = local_a0;
    iStack_7c = local_80;
    iStack_78 = local_80;
    iStack_74 = local_80;
    iStack_70 = local_80;
    iStack_6c = local_80;
    iStack_68 = local_80;
    iStack_64 = local_80;
    round_shift_8x8_avx2(out,out_shift);
    highbd_clamp_epi32_avx2(out,out,(__m256i *)&local_80,(__m256i *)&local_a0,0x10);
  }
  return;
}

Assistant:

static void idct16_avx2(__m256i *in, __m256i *out, int bit, int do_cols, int bd,
                        int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospim4 = _mm256_set1_epi32(-cospi[4]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospim20 = _mm256_set1_epi32(-cospi[20]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[16], v[16], x, y;

  {
    // stage 0
    // stage 1
    u[0] = in[0];
    u[1] = in[8];
    u[2] = in[4];
    u[3] = in[12];
    u[4] = in[2];
    u[5] = in[10];
    u[6] = in[6];
    u[7] = in[14];
    u[8] = in[1];
    u[9] = in[9];
    u[10] = in[5];
    u[11] = in[13];
    u[12] = in[3];
    u[13] = in[11];
    u[14] = in[7];
    u[15] = in[15];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = half_btf_avx2(&cospi60, &u[8], &cospim4, &u[15], &rnding, bit);
    v[9] = half_btf_avx2(&cospi28, &u[9], &cospim36, &u[14], &rnding, bit);
    v[10] = half_btf_avx2(&cospi44, &u[10], &cospim20, &u[13], &rnding, bit);
    v[11] = half_btf_avx2(&cospi12, &u[11], &cospim52, &u[12], &rnding, bit);
    v[12] = half_btf_avx2(&cospi52, &u[11], &cospi12, &u[12], &rnding, bit);
    v[13] = half_btf_avx2(&cospi20, &u[10], &cospi44, &u[13], &rnding, bit);
    v[14] = half_btf_avx2(&cospi36, &u[9], &cospi28, &u[14], &rnding, bit);
    v[15] = half_btf_avx2(&cospi4, &u[8], &cospi60, &u[15], &rnding, bit);

    // stage 3
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];
    u[4] = half_btf_avx2(&cospi56, &v[4], &cospim8, &v[7], &rnding, bit);
    u[5] = half_btf_avx2(&cospi24, &v[5], &cospim40, &v[6], &rnding, bit);
    u[6] = half_btf_avx2(&cospi40, &v[5], &cospi24, &v[6], &rnding, bit);
    u[7] = half_btf_avx2(&cospi8, &v[4], &cospi56, &v[7], &rnding, bit);
    addsub_avx2(v[8], v[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
    addsub_avx2(v[11], v[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(v[12], v[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(v[15], v[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

    // stage 4
    x = _mm256_mullo_epi32(u[0], cospi32);
    y = _mm256_mullo_epi32(u[1], cospi32);
    v[0] = _mm256_add_epi32(x, y);
    v[0] = _mm256_add_epi32(v[0], rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    v[1] = _mm256_sub_epi32(x, y);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    v[2] = half_btf_avx2(&cospi48, &u[2], &cospim16, &u[3], &rnding, bit);
    v[3] = half_btf_avx2(&cospi16, &u[2], &cospi48, &u[3], &rnding, bit);
    addsub_avx2(u[4], u[5], &v[4], &v[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[7], u[6], &v[7], &v[6], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    v[10] = half_btf_avx2(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    v[11] = u[11];
    v[12] = u[12];
    v[13] = half_btf_avx2(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    v[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    v[15] = u[15];

    // stage 5
    addsub_avx2(v[0], v[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
    addsub_avx2(v[1], v[2], &u[1], &u[2], &clamp_lo, &clamp_hi);
    u[4] = v[4];

    x = _mm256_mullo_epi32(v[5], cospi32);
    y = _mm256_mullo_epi32(v[6], cospi32);
    u[5] = _mm256_sub_epi32(y, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_add_epi32(y, x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[7] = v[7];
    addsub_avx2(v[8], v[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(v[9], v[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(v[15], v[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(v[14], v[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    // stage 6
    addsub_avx2(u[0], u[7], &v[0], &v[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[6], &v[1], &v[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[5], &v[2], &v[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[4], &v[3], &v[4], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = u[9];

    x = _mm256_mullo_epi32(u[10], cospi32);
    y = _mm256_mullo_epi32(u[13], cospi32);
    v[10] = _mm256_sub_epi32(y, x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_add_epi32(x, y);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    x = _mm256_mullo_epi32(u[11], cospi32);
    y = _mm256_mullo_epi32(u[12], cospi32);
    v[11] = _mm256_sub_epi32(y, x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = _mm256_add_epi32(x, y);
    v[12] = _mm256_add_epi32(v[12], rnding);
    v[12] = _mm256_srai_epi32(v[12], bit);

    v[14] = u[14];
    v[15] = u[15];

    // stage 7
    addsub_avx2(v[0], v[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
    addsub_avx2(v[1], v[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
    addsub_avx2(v[2], v[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(v[3], v[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
    addsub_avx2(v[4], v[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
    addsub_avx2(v[5], v[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(v[6], v[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(v[7], v[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
      round_shift_8x8_avx2(out, out_shift);
      highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 16);
    }
  }
}